

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

void __thiscall
cmConditionEvaluator::cmConditionEvaluator
          (cmConditionEvaluator *this,cmMakefile *makefile,cmListFileContext *context,
          cmListFileBacktrace *bt)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  PolicyStatus PVar3;
  
  this->Makefile = makefile;
  cmListFileContext::cmListFileContext(&this->ExecutionContext,context);
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (bt->TopEntry).
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (bt->TopEntry).
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (bt->TopEntry).super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  (bt->TopEntry).super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0012,false);
  this->Policy12Status = PVar3;
  PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0054,false);
  this->Policy54Status = PVar3;
  PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0057,false);
  this->Policy57Status = PVar3;
  PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0064,false);
  this->Policy64Status = PVar3;
  return;
}

Assistant:

cmConditionEvaluator::cmConditionEvaluator(cmMakefile& makefile,
                                           cmListFileContext context,
                                           cmListFileBacktrace bt)
  : Makefile(makefile)
  , ExecutionContext(std::move(context))
  , Backtrace(std::move(bt))
  , Policy12Status(makefile.GetPolicyStatus(cmPolicies::CMP0012))
  , Policy54Status(makefile.GetPolicyStatus(cmPolicies::CMP0054))
  , Policy57Status(makefile.GetPolicyStatus(cmPolicies::CMP0057))
  , Policy64Status(makefile.GetPolicyStatus(cmPolicies::CMP0064))
{
}